

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_builtins.cpp
# Opt level: O1

string * __thiscall
spvtools::val::(anonymous_namespace)::BuiltInsValidator::GetReferenceDesc_abi_cxx11_
          (string *__return_storage_ptr__,void *this,Decoration *decoration,
          Instruction *built_in_inst,Instruction *referenced_inst,Instruction *referenced_from_inst,
          ExecutionModel execution_model)

{
  long *plVar1;
  string *psVar2;
  spv_result_t sVar3;
  ostream *poVar4;
  size_t sVar5;
  Instruction *inst;
  Instruction *inst_00;
  Instruction *inst_01;
  char *pcVar6;
  spv_operand_desc desc;
  ostringstream ss;
  long *local_1f8;
  string *local_1f0;
  string local_1e8;
  string local_1c8;
  long local_1a8 [14];
  ios_base local_138 [264];
  
  local_1f8 = (long *)this;
  local_1f0 = __return_storage_ptr__;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  GetIdDesc_abi_cxx11_(&local_1e8,(_anonymous_namespace_ *)referenced_from_inst,inst);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1a8,local_1e8._M_dataplus._M_p,local_1e8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," is referencing ",0x10);
  GetIdDesc_abi_cxx11_(&local_1c8,(_anonymous_namespace_ *)referenced_inst,inst_00);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,local_1c8._M_dataplus._M_p,local_1c8._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
    operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
    operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
  }
  if ((built_in_inst->inst_).result_id != (referenced_inst->inst_).result_id) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8," which is dependent on ",0x17);
    GetIdDesc_abi_cxx11_(&local_1e8,(_anonymous_namespace_ *)built_in_inst,inst_01);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,local_1e8._M_dataplus._M_p,local_1e8._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
      operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8," which is decorated with BuiltIn ",0x21);
  plVar1 = local_1f8;
  if (decoration->dec_type_ == BuiltIn) {
    local_1e8._M_dataplus._M_p = (pointer)0x0;
    sVar3 = AssemblyGrammar::lookupOperand
                      ((AssemblyGrammar *)(*local_1f8 + 0x438),SPV_OPERAND_TYPE_BUILT_IN,
                       *(decoration->params_).
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start,(spv_operand_desc *)&local_1e8);
    if (local_1e8._M_dataplus._M_p == (pointer)0x0 || sVar3 != SPV_SUCCESS) {
      pcVar6 = "Unknown";
    }
    else {
      pcVar6 = *(char **)local_1e8._M_dataplus._M_p;
    }
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)&local_1f8 + (int)*(undefined8 *)(local_1a8[0] + -0x18) + 0x50);
    }
    else {
      sVar5 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar6,sVar5);
    }
    if ((int)plVar1[7] != 0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," in function <",0xe);
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,">",1);
      if (execution_model != ExecutionModelMax) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8," called with execution model ",0x1d);
        local_1e8._M_dataplus._M_p = (pointer)0x0;
        sVar3 = AssemblyGrammar::lookupOperand
                          ((AssemblyGrammar *)(*plVar1 + 0x438),SPV_OPERAND_TYPE_EXECUTION_MODEL,
                           execution_model,(spv_operand_desc *)&local_1e8);
        if (local_1e8._M_dataplus._M_p == (pointer)0x0 || sVar3 != SPV_SUCCESS) {
          pcVar6 = "Unknown";
        }
        else {
          pcVar6 = *(char **)local_1e8._M_dataplus._M_p;
        }
        if (pcVar6 == (char *)0x0) {
          std::ios::clear((int)&local_1f8 + (int)*(undefined8 *)(local_1a8[0] + -0x18) + 0x50);
        }
        else {
          sVar5 = strlen(pcVar6);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar6,sVar5);
        }
      }
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,".",1);
    psVar2 = local_1f0;
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
    return psVar2;
  }
  __assert_fail("dec_type_ == spv::Decoration::BuiltIn",
                "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/decoration.h"
                ,0x4f,"spv::BuiltIn spvtools::val::Decoration::builtin() const");
}

Assistant:

std::string BuiltInsValidator::GetReferenceDesc(
    const Decoration& decoration, const Instruction& built_in_inst,
    const Instruction& referenced_inst, const Instruction& referenced_from_inst,
    spv::ExecutionModel execution_model) const {
  std::ostringstream ss;
  ss << GetIdDesc(referenced_from_inst) << " is referencing "
     << GetIdDesc(referenced_inst);
  if (built_in_inst.id() != referenced_inst.id()) {
    ss << " which is dependent on " << GetIdDesc(built_in_inst);
  }

  ss << " which is decorated with BuiltIn ";
  ss << _.grammar().lookupOperandName(SPV_OPERAND_TYPE_BUILT_IN,
                                      (uint32_t)decoration.builtin());
  if (function_id_) {
    ss << " in function <" << function_id_ << ">";
    if (execution_model != spv::ExecutionModel::Max) {
      ss << " called with execution model ";
      ss << _.grammar().lookupOperandName(SPV_OPERAND_TYPE_EXECUTION_MODEL,
                                          uint32_t(execution_model));
    }
  }
  ss << ".";
  return ss.str();
}